

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetEtaForm(void *kinmem,int etachoice)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x1c6;
  }
  else {
    if (etachoice - 1U < 3) {
      *(int *)((long)kinmem + 0x58) = etachoice;
      return 0;
    }
    msgfmt = "Illegal value for etachoice.";
    iVar1 = -2;
    error_code = -2;
    line = 0x1cf;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetEtaForm",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetEtaForm(void* kinmem, int etachoice)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if ((etachoice != KIN_ETACONSTANT) && (etachoice != KIN_ETACHOICE1) &&
      (etachoice != KIN_ETACHOICE2))
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ETACHOICE);
    return (KIN_ILL_INPUT);
  }

  kin_mem->kin_etaflag = etachoice;

  return (KIN_SUCCESS);
}